

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_set_ge_zinv(secp256k1_ge *r,secp256k1_ge *a,secp256k1_fe *zi)

{
  secp256k1_fe *in_RDX;
  long in_RSI;
  long in_RDI;
  secp256k1_fe zi3;
  secp256k1_fe zi2;
  secp256k1_fe *in_stack_ffffffffffffff98;
  secp256k1_fe *in_stack_ffffffffffffffa0;
  
  secp256k1_ge_verify((secp256k1_ge *)0x11ac4d);
  secp256k1_fe_verify(in_RDX);
  secp256k1_fe_impl_sqr(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  secp256k1_fe_impl_mul
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(secp256k1_fe *)0x11ac78);
  secp256k1_fe_impl_mul
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(secp256k1_fe *)0x11ac8c);
  secp256k1_fe_impl_mul
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(secp256k1_fe *)0x11aca6);
  *(undefined4 *)(in_RDI + 0x50) = *(undefined4 *)(in_RSI + 0x50);
  secp256k1_ge_verify((secp256k1_ge *)0x11acc0);
  return;
}

Assistant:

static void secp256k1_ge_set_ge_zinv(secp256k1_ge *r, const secp256k1_ge *a, const secp256k1_fe *zi) {
    secp256k1_fe zi2;
    secp256k1_fe zi3;
    SECP256K1_GE_VERIFY(a);
    SECP256K1_FE_VERIFY(zi);
    VERIFY_CHECK(!a->infinity);

    secp256k1_fe_sqr(&zi2, zi);
    secp256k1_fe_mul(&zi3, &zi2, zi);
    secp256k1_fe_mul(&r->x, &a->x, &zi2);
    secp256k1_fe_mul(&r->y, &a->y, &zi3);
    r->infinity = a->infinity;

    SECP256K1_GE_VERIFY(r);
}